

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::setJointPos(KinDynComputations *this,Span<const_double,__1L> s)

{
  element_type *peVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  element_type eVar3;
  Index size;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Index index;
  ulong uVar7;
  pointer peVar8;
  long lVar9;
  ulong uVar10;
  
  peVar8 = s.storage_.data_;
  lVar4 = iDynTree::Model::getNrOfPosCoords();
  if (lVar4 == s.storage_.super_extent_type<_1L>.size_.size_) {
    iDynTree::FreeFloatingPos::jointPos();
    uVar5 = iDynTree::VectorDynSize::data();
    uVar6 = iDynTree::VectorDynSize::size();
    uVar7 = uVar6;
    if (((uVar5 & 7) == 0) && (uVar7 = (ulong)((uint)(uVar5 >> 3) & 1), (long)uVar6 <= (long)uVar7))
    {
      uVar7 = uVar6;
    }
    lVar9 = uVar6 - uVar7;
    if (0 < (long)uVar7) {
      uVar10 = 0;
      do {
        *(element_type *)(uVar5 + uVar10 * 8) = peVar8[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    uVar10 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar7;
    if (1 < lVar9) {
      do {
        eVar3 = (peVar8 + uVar7)[1];
        peVar1 = (element_type *)(uVar5 + uVar7 * 8);
        *peVar1 = peVar8[uVar7];
        peVar1[1] = eVar3;
        uVar7 = uVar7 + 2;
      } while ((long)uVar7 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar6) {
      do {
        *(element_type *)(uVar5 + uVar10 * 8) = peVar8[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    pKVar2 = this->pimpl;
    pKVar2->m_isFwdKinematicsUpdated = false;
    pKVar2->m_isRawMassMatrixUpdated = false;
    pKVar2->m_areBiasAccelerationsUpdated = false;
  }
  else {
    iDynTree::reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
  }
  return lVar4 == s.storage_.super_extent_type<_1L>.size_.size_;
}

Assistant:

bool KinDynComputations::setJointPos(Span<const double> s)
{
    bool ok = (s.size() == pimpl->m_robot_model.getNrOfPosCoords());
    if( !ok )
    {
        reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
        return false;
    }

    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Invalidate cache
    this->invalidateCache();

    return true;
}